

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int toLocaltime(DateTime *p,sqlite3_context *pCtx)

{
  int iVar1;
  uint uVar2;
  tm *ptVar3;
  ulong uVar4;
  int iVar5;
  long in_FS_OFFSET;
  tm sLocal;
  time_t t;
  DateTime local_a8;
  tm local_78;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.tm_sec = 0;
  local_78.tm_min = 0;
  local_78.tm_hour = 0;
  local_78.tm_mday = 0;
  local_78.tm_mon = 0;
  local_78.tm_year = 0;
  local_78.tm_wday = 0;
  local_78.tm_yday = 0;
  local_78.tm_isdst = 0;
  local_78._36_4_ = 0;
  local_78.tm_gmtoff = 0;
  local_78.tm_zone = (char *)0x0;
  computeJD(p);
  if (p->iJD - 0xc1bc387b0a01U < 0xfffffe0c05d817ff) {
    local_a8.iJD = p->iJD;
    local_a8.Y = p->Y;
    local_a8.M = p->M;
    local_a8.D = p->D;
    local_a8.h = p->h;
    local_a8.m = p->m;
    local_a8.tz = p->tz;
    local_a8.s = p->s;
    local_a8.validJD = p->validJD;
    local_a8.validYMD = p->validYMD;
    local_a8.validHMS = p->validHMS;
    local_a8.nFloor = p->nFloor;
    local_a8._44_4_ = *(undefined4 *)&p->field_0x2c;
    computeYMD(&local_a8);
    computeHMS(&local_a8);
    iVar1 = local_a8.Y % 4 + 2000;
    iVar5 = local_a8.Y - iVar1;
    local_a8.Y = iVar1;
    local_a8._40_8_ = local_a8._40_8_ & 0xffffffffffffff00;
    computeJD(&local_a8);
    uVar4 = local_a8.iJD / 1000;
    iVar5 = iVar5 + 0x76c;
  }
  else {
    uVar4 = (ulong)p->iJD / 1000;
    iVar5 = 0x76c;
  }
  local_38 = (undefined1 *)(uVar4 - 0x3118a36940);
  if (sqlite3Config.bLocaltimeFault == 0) {
    ptVar3 = localtime_r((time_t *)&local_38,&local_78);
    uVar2 = (uint)(ptVar3 == (tm *)0x0);
  }
  else if (sqlite3Config.xAltLocaltime == (_func_int_void_ptr_void_ptr *)0x0) {
    uVar2 = 1;
  }
  else {
    uVar2 = (*sqlite3Config.xAltLocaltime)(&local_38,&local_78);
  }
  if (uVar2 == 0) {
    p->Y = iVar5 + local_78.tm_year;
    p->M = local_78.tm_mon + 1;
    p->D = local_78.tm_mday;
    p->h = local_78.tm_hour;
    p->m = local_78.tm_min;
    p->s = (double)(p->iJD % 1000) * 0.001 + (double)local_78.tm_sec;
    p->validYMD = '\x01';
    p->validHMS = '\x01';
    p->validJD = '\0';
    p->tz = 0;
    p->field_0x2c = p->field_0x2c & 0xfc;
  }
  else {
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr
              (pCtx->pOut,"local time unavailable",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (uint)(uVar2 != 0);
  }
  __stack_chk_fail();
}

Assistant:

static int toLocaltime(
  DateTime *p,                   /* Date at which to calculate offset */
  sqlite3_context *pCtx          /* Write error here if one occurs */
){
  time_t t;
  struct tm sLocal;
  int iYearDiff;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  computeJD(p);
  if( p->iJD<2108667600*(i64)100000 /* 1970-01-01 */
   || p->iJD>2130141456*(i64)100000 /* 2038-01-18 */
  ){
    /* EVIDENCE-OF: R-55269-29598 The localtime_r() C function normally only
    ** works for years between 1970 and 2037. For dates outside this range,
    ** SQLite attempts to map the year into an equivalent year within this
    ** range, do the calculation, then map the year back.
    */
    DateTime x = *p;
    computeYMD_HMS(&x);
    iYearDiff = (2000 + x.Y%4) - x.Y;
    x.Y += iYearDiff;
    x.validJD = 0;
    computeJD(&x);
    t = (time_t)(x.iJD/1000 -  21086676*(i64)10000);
  }else{
    iYearDiff = 0;
    t = (time_t)(p->iJD/1000 -  21086676*(i64)10000);
  }
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    return SQLITE_ERROR;
  }
  p->Y = sLocal.tm_year + 1900 - iYearDiff;
  p->M = sLocal.tm_mon + 1;
  p->D = sLocal.tm_mday;
  p->h = sLocal.tm_hour;
  p->m = sLocal.tm_min;
  p->s = sLocal.tm_sec + (p->iJD%1000)*0.001;
  p->validYMD = 1;
  p->validHMS = 1;
  p->validJD = 0;
  p->rawS = 0;
  p->tz = 0;
  p->isError = 0;
  return SQLITE_OK;
}